

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O1

void __thiscall ExecutorX86::Resume(ExecutorX86 *this)

{
  (this->vmState).callStackTop = (this->vmState).callStackBase + this->execErrorFinalReturnDepth;
  this->codeRunning = true;
  this->callContinue = true;
  this->execErrorMessage = (char *)0x0;
  *(undefined8 *)&this->execErrorObject = 0;
  *(undefined4 *)((long)&(this->execErrorObject).ptr + 4) = 0;
  return;
}

Assistant:

void ExecutorX86::Resume()
{
	vmState.callStackTop = vmState.callStackBase + execErrorFinalReturnDepth;

	codeRunning = true;

	callContinue = true;

	execErrorMessage = NULL;

	execErrorObject.typeID = 0;
	execErrorObject.ptr = NULL;
}